

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void exp_repeat_push(lyxp_expr *exp,uint16_t exp_idx,uint16_t repeat_op_idx)

{
  lyxp_expr_type **pplVar1;
  lyxp_expr_type *__ptr;
  long lVar2;
  uint *puVar3;
  uint uVar4;
  void *pvVar5;
  undefined6 in_register_00000032;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  
  pplVar1 = exp->repeat;
  __ptr = pplVar1[CONCAT62(in_register_00000032,exp_idx) & 0xffffffff];
  iVar7 = (int)CONCAT62(in_register_00000032,exp_idx);
  if (__ptr == (lyxp_expr_type *)0x0) {
    pvVar5 = calloc(2,4);
    uVar6 = (ulong)(uint)(iVar7 << 3);
    *(void **)((long)pplVar1 + uVar6) = pvVar5;
    puVar3 = *(uint **)((long)exp->repeat + uVar6);
    if (puVar3 == (uint *)0x0) goto LAB_00178fc7;
    *puVar3 = (uint)repeat_op_idx;
  }
  else {
    uVar4 = 0xffff;
    do {
      uVar4 = uVar4 + 1;
      uVar6 = (ulong)(uVar4 & 0xffff);
    } while (__ptr[uVar6] != LYXP_EXPR_NONE);
    pvVar5 = realloc(__ptr,uVar6 * 4 + 8);
    uVar8 = (ulong)(uint)(iVar7 << 3);
    *(void **)((long)exp->repeat + uVar8) = pvVar5;
    lVar2 = *(long *)((long)exp->repeat + uVar8);
    if (lVar2 == 0) {
LAB_00178fc7:
      ly_log((ly_ctx *)0x0,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","exp_repeat_push");
      return;
    }
    *(uint *)(lVar2 + uVar6 * 4) = (uint)repeat_op_idx;
    *(undefined4 *)(lVar2 + 4 + uVar6 * 4) = 0;
  }
  return;
}

Assistant:

static void
exp_repeat_push(struct lyxp_expr *exp, uint16_t exp_idx, uint16_t repeat_op_idx)
{
    uint16_t i;

    if (exp->repeat[exp_idx]) {
        for (i = 0; exp->repeat[exp_idx][i]; ++i);
        exp->repeat[exp_idx] = realloc(exp->repeat[exp_idx], (i + 2) * sizeof *exp->repeat[exp_idx]);
        LY_CHECK_ERR_RETURN(!exp->repeat[exp_idx], LOGMEM(NULL), );
        exp->repeat[exp_idx][i] = repeat_op_idx;
        exp->repeat[exp_idx][i + 1] = 0;
    } else {
        exp->repeat[exp_idx] = calloc(2, sizeof *exp->repeat[exp_idx]);
        LY_CHECK_ERR_RETURN(!exp->repeat[exp_idx], LOGMEM(NULL), );
        exp->repeat[exp_idx][0] = repeat_op_idx;
    }
}